

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

bool __thiscall QTreeView::viewportEvent(QTreeView *this,QEvent *event)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  QWidget *this_01;
  QHoverEvent *he;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  QRect local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    iVar1 = this_00->hoverBranch;
    auVar8 = QEventPoint::position();
    dVar6 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar4 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_48._0_4_ =
         (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar6);
    dVar6 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar4 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_48._4_4_ =
         (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar6);
    iVar5 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_48);
    this_00->hoverBranch = iVar5;
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    auVar8 = QEventPoint::position();
    dVar6 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar4 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_58.y1.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar7);
    local_58.x1.m_i =
         (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar6);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))((QModelIndex *)&local_48,this);
    cVar3 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).hover,(QModelIndex *)&local_48)
    ;
    if ((cVar3 == '\0') || (this_00->hoverBranch != iVar1)) {
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      local_58 = QTreeViewPrivate::visualRect(this_00,(QModelIndex *)&local_48,FullRow);
      QWidget::update(this_01,&local_58);
    }
  }
  bVar4 = QAbstractItemView::viewportEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::viewportEvent(QEvent *event)
{
    Q_D(QTreeView);
    switch (event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove: {
        QHoverEvent *he = static_cast<QHoverEvent*>(event);
        const int oldBranch = d->hoverBranch;
        d->hoverBranch = d->itemDecorationAt(he->position().toPoint());
        QModelIndex newIndex = indexAt(he->position().toPoint());
        if (d->hover != newIndex || d->hoverBranch != oldBranch) {
            // Update the whole hovered over row. No need to update the old hovered
            // row, that is taken care in superclass hover handling.
            viewport()->update(d->visualRect(newIndex, QTreeViewPrivate::FullRow));
        }
        break; }
    default:
        break;
    }
    return QAbstractItemView::viewportEvent(event);
}